

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

void NscSimplifyConstant(uchar *pauchData,size_t *nDataSize)

{
  ulong uVar1;
  
  uVar1 = *nDataSize;
  if ((0xf < uVar1) && (*(int *)(pauchData + 8) == 0x34)) {
    if (*(int *)(pauchData + 0xc) == 7) {
      if (uVar1 != 0x28) {
        return;
      }
      if (*(int *)(pauchData + 0x20) != 0x20) {
        return;
      }
      *(uint *)(pauchData + 0x10) = *(uint *)(pauchData + 0x10) ^ 0x80000000;
    }
    else {
      if (*(int *)(pauchData + 0xc) != 6) {
        return;
      }
      if (uVar1 != 0x28) {
        return;
      }
      if (*(int *)(pauchData + 0x20) != 0x20) {
        return;
      }
      *(int *)(pauchData + 0x10) = -*(int *)(pauchData + 0x10);
    }
    *nDataSize = 0x18;
  }
  return;
}

Assistant:

void NscSimplifyConstant (unsigned char *pauchData, size_t &nDataSize)
{

	//
	// Check for basic size
	//

	if (nDataSize < sizeof (NscPCodeHeader)) 
		return;

	//
	// Verify we have a constant at least
	//

	NscPCodeHeader *pHeader = (NscPCodeHeader *) pauchData;
	if (pHeader ->nOpCode != NscPCode_Constant)
		return;

	//
	// If we have an integer
	//

	if (pHeader ->nType == NscType_Integer)
	{
		if (nDataSize == sizeof (NscPCodeConstantInteger))
			return;
		NscPCodeConstantInteger *pCI = (NscPCodeConstantInteger *) pauchData;
		NscPCodeHeader *pNeg = (NscPCodeHeader *) &pauchData [sizeof (*pCI)];
		if (nDataSize == sizeof (*pCI) + sizeof (*pNeg) &&
			pNeg ->nOpCode == NscPCode_Negate)
		{
			pCI ->lValue = - pCI ->lValue;
			nDataSize = sizeof (*pCI);
		}
	}

	//
	// Otherwise, if we have float
	//

	else if (pHeader ->nType == NscType_Float)
	{
		if (nDataSize == sizeof (NscPCodeConstantFloat))
			return;
		NscPCodeConstantFloat *pCF = (NscPCodeConstantFloat *) pauchData;
		NscPCodeHeader *pNeg = (NscPCodeHeader *) &pauchData [sizeof (*pCF)];
        if (nDataSize == sizeof (*pCF) + sizeof (*pNeg) &&
			pNeg ->nOpCode == NscPCode_Negate)
		{
			pCF ->fValue = - pCF ->fValue;
			nDataSize = sizeof (*pCF);
		}
	}
}